

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

int tcache_create_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                     size_t newlen)

{
  ulong uVar1;
  _Bool _Var2;
  int iVar3;
  undefined8 in_RAX;
  size_t __n;
  uint tcache_ind;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  iVar3 = 1;
  if (newp == (void *)0x0 && newlen == 0) {
    _Var2 = tcaches_create(tsd,&local_14);
    iVar3 = 0xe;
    if (!_Var2) {
      iVar3 = 0;
      if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
        uVar1 = *oldlenp;
        if (uVar1 == 4) {
          *(uint *)oldp = local_14;
          iVar3 = 0;
        }
        else {
          __n = 4;
          if (uVar1 < 4) {
            __n = uVar1;
          }
          memcpy(oldp,&local_14,__n);
          iVar3 = 0x16;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int
tcache_create_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned tcache_ind;

	READONLY();
	if (tcaches_create(tsd, &tcache_ind)) {
		ret = EFAULT;
		goto label_return;
	}
	READ(tcache_ind, unsigned);

	ret = 0;
label_return:
	return ret;
}